

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O1

coda_expression *
coda_expression_new(coda_expression_node_type tag,char *string_value,coda_expression *op1,
                   coda_expression *op2,coda_expression *op3,coda_expression *op4)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  coda_expression_type cVar4;
  uint uVar5;
  coda_expression *pcVar6;
  size_t sVar7;
  undefined8 uVar8;
  char cVar9;
  long lVar10;
  undefined8 uVar11;
  long lVar12;
  double local_40;
  coda_expression *local_38;
  
  switch(tag) {
  case expr_constant_boolean:
    pcVar6 = (coda_expression *)malloc(0x14);
    if (pcVar6 == (coda_expression *)0x0) {
      pcVar6 = (coda_expression *)0x0;
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x14,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                     ,0xe8);
    }
    else {
      pcVar6->tag = expr_constant_boolean;
      pcVar6->result_type = coda_expression_boolean;
      pcVar6->is_constant = 1;
      pcVar6->recursion_depth = 0;
      pcVar6[1].tag = (uint)((*string_value & 0xdfU) == 0x54);
    }
    free(string_value);
    return pcVar6;
  case expr_constant_float:
    sVar7 = strlen(string_value);
    lVar10 = coda_ascii_parse_double(string_value,sVar7,&local_40,0);
    free(string_value);
    if (lVar10 < 0) {
      return (coda_expression *)0x0;
    }
    pcVar6 = (coda_expression *)malloc(0x18);
    if (pcVar6 != (coda_expression *)0x0) {
      pcVar6->tag = expr_constant_float;
      pcVar6->result_type = coda_expression_float;
      pcVar6->is_constant = 1;
      pcVar6->recursion_depth = 0;
      *(double *)(pcVar6 + 1) = local_40;
      return pcVar6;
    }
    uVar8 = 0x18;
    uVar11 = 0x106;
    goto LAB_001113e4;
  case expr_constant_integer:
    sVar7 = strlen(string_value);
    lVar10 = coda_ascii_parse_int64(string_value,sVar7,(int64_t *)&local_40,0);
    free(string_value);
    if (lVar10 < 0) {
      return (coda_expression *)0x0;
    }
    pcVar6 = (coda_expression *)malloc(0x18);
    if (pcVar6 != (coda_expression *)0x0) {
      pcVar6->tag = expr_constant_integer;
      pcVar6->result_type = coda_expression_integer;
      pcVar6->is_constant = 1;
      pcVar6->recursion_depth = 0;
      *(double *)(pcVar6 + 1) = local_40;
      return pcVar6;
    }
    uVar8 = 0x18;
    uVar11 = 0x122;
    goto LAB_001113e4;
  case expr_constant_rawstring:
    pcVar6 = (coda_expression *)malloc(0x20);
    if (pcVar6 != (coda_expression *)0x0) {
      pcVar6->tag = expr_constant_rawstring;
      pcVar6->result_type = coda_expression_string;
      pcVar6->is_constant = 1;
      pcVar6->recursion_depth = 0;
      sVar7 = strlen(string_value);
      pcVar6[1].tag = (int)sVar7;
      pcVar6[1].result_type = (int)(sVar7 >> 0x20);
      *(char **)&pcVar6[1].is_constant = string_value;
      return pcVar6;
    }
    uVar8 = 0x20;
    uVar11 = 0x136;
LAB_001113e4:
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",uVar8,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                   ,uVar11);
    return (coda_expression *)0x0;
  case expr_constant_string:
    if (string_value != (char *)0x0) {
      lVar10 = 0;
      lVar12 = 0;
      do {
        cVar9 = string_value[lVar10];
        if (cVar9 == '\\') {
          lVar1 = lVar10 + 1;
          bVar3 = string_value[lVar10 + 1];
          if (bVar3 < 0x6e) {
            switch(bVar3) {
            case 0x5c:
              string_value[lVar12] = '\\';
              lVar10 = lVar1;
              break;
            case 0x5d:
            case 0x5e:
            case 0x5f:
            case 0x60:
            case 99:
            case 100:
              goto switchD_0011106d_caseD_5d;
            case 0x61:
              string_value[lVar12] = '\a';
              lVar10 = lVar1;
              break;
            case 0x62:
              string_value[lVar12] = '\b';
              lVar10 = lVar1;
              break;
            case 0x65:
              string_value[lVar12] = '\x1b';
              lVar10 = lVar1;
              break;
            case 0x66:
              string_value[lVar12] = '\f';
              lVar10 = lVar1;
              break;
            default:
              if (bVar3 == 0x22) {
                string_value[lVar12] = '\"';
                lVar10 = lVar1;
              }
              else {
                if (bVar3 != 0x27) goto switchD_0011106d_caseD_5d;
                string_value[lVar12] = '\'';
                lVar10 = lVar1;
              }
            }
          }
          else {
            switch(bVar3) {
            case 0x6e:
              string_value[lVar12] = '\n';
              lVar10 = lVar1;
              break;
            default:
switchD_0011106d_caseD_5d:
              if (0xf5 < (byte)(bVar3 - 0x3a)) {
                string_value[lVar12] = bVar3 * '@';
                if (0xf5 < (byte)(string_value[lVar10 + 2] - 0x3aU)) {
                  cVar9 = (string_value[lVar10 + 2] & 0xfU) * '\b' + bVar3 * '@';
                  string_value[lVar12] = cVar9;
                  lVar1 = lVar10 + 3;
                  if (0xf5 < (byte)(string_value[lVar1] - 0x3aU)) {
                    lVar10 = lVar10 + 3;
                    string_value[lVar12] = cVar9 + string_value[lVar1] + -0x30;
                    break;
                  }
                }
              }
              coda_set_error(-0x67,"invalid escape sequence in string");
              lVar12 = -1;
              goto LAB_00111387;
            case 0x72:
              string_value[lVar12] = '\r';
              lVar10 = lVar1;
              break;
            case 0x74:
              string_value[lVar12] = '\t';
              lVar10 = lVar1;
              break;
            case 0x76:
              string_value[lVar12] = '\v';
              lVar10 = lVar1;
            }
          }
        }
        else {
          if (cVar9 == '\0') goto LAB_00111241;
          string_value[lVar12] = cVar9;
        }
        lVar12 = lVar12 + 1;
        lVar10 = lVar10 + 1;
      } while( true );
    }
    lVar12 = 0;
    goto LAB_00111387;
  default:
    if (tag == expr_neg) {
      if (op1->tag == expr_constant_integer) {
        *(long *)(op1 + 1) = -*(long *)(op1 + 1);
        return op1;
      }
      if (op1->tag == expr_constant_float) {
        uVar2._0_4_ = op1[1].tag;
        uVar2._4_4_ = op1[1].result_type;
        op1[1].tag = (int)(uVar2 ^ 0x8000000000000000);
        op1[1].result_type = (int)((uVar2 ^ 0x8000000000000000) >> 0x20);
        return op1;
      }
    }
    local_38 = op4;
    pcVar6 = (coda_expression *)malloc(0x38);
    if (pcVar6 == (coda_expression *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x38,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                     ,0x188);
      if (string_value != (char *)0x0) {
        free(string_value);
      }
      if (op1 != (coda_expression *)0x0) {
        coda_expression_delete(op1);
      }
      if (op2 != (coda_expression *)0x0) {
        coda_expression_delete(op2);
      }
      if (op3 != (coda_expression *)0x0) {
        coda_expression_delete(op3);
      }
      if (local_38 == (coda_expression *)0x0) {
        return (coda_expression *)0x0;
      }
      coda_expression_delete(local_38);
      return (coda_expression *)0x0;
    }
  }
  pcVar6->tag = tag;
  *(char **)(pcVar6 + 1) = string_value;
  *(coda_expression **)&pcVar6[1].is_constant = op1;
  *(coda_expression **)(pcVar6 + 2) = op2;
  *(coda_expression **)&pcVar6[2].is_constant = op3;
  *(coda_expression **)(pcVar6 + 3) = local_38;
  switch(tag) {
  case expr_abs:
  case expr_neg:
    cVar4 = op1->result_type;
    goto LAB_00111423;
  case expr_add:
  case expr_divide:
  case expr_max:
  case expr_min:
  case expr_modulo:
  case expr_multiply:
  case expr_subtract:
    cVar4 = op1->result_type;
    if ((cVar4 == coda_expression_float) || (op2->result_type == coda_expression_float))
    goto switchD_00110ffb_caseD_11;
    goto LAB_00111423;
  case expr_and:
  case expr_array_count:
  case expr_array_index:
  case expr_bit_offset:
  case expr_bit_size:
  case expr_byte_offset:
  case expr_byte_size:
  case expr_dim:
  case expr_file_size:
  case expr_index:
  case expr_index_var:
  case expr_integer:
  case expr_length:
  case expr_num_dims:
  case expr_num_elements:
  case expr_or:
  case expr_product_version:
  case expr_unbound_array_index:
  case expr_variable_index:
  case expr_variable_value:
    pcVar6->result_type = coda_expression_integer;
    break;
  case expr_array_add:
  case expr_array_max:
  case expr_array_min:
  case expr_at:
  case expr_if:
  case expr_with:
    cVar4 = op2->result_type;
LAB_00111423:
    pcVar6->result_type = cVar4;
    break;
  case expr_array_all:
  case expr_array_exists:
  case expr_equal:
  case expr_exists:
  case expr_greater_equal:
  case expr_greater:
  case expr_isinf:
  case expr_ismininf:
  case expr_isnan:
  case expr_isplusinf:
  case expr_less_equal:
  case expr_less:
  case expr_logical_and:
  case expr_logical_or:
  case expr_not_equal:
  case expr_not:
  case expr_variable_exists:
    goto switchD_00110ffb_caseD_4;
  case expr_asciiline:
  case expr_goto_array_element:
  case expr_goto_attribute:
  case expr_goto_begin:
  case expr_goto_field:
  case expr_goto_here:
  case expr_goto_parent:
  case expr_goto_root:
    pcVar6->result_type = coda_expression_node;
    break;
  case expr_bytes:
  case expr_filename:
  case expr_ltrim:
  case expr_product_class:
  case expr_product_format:
  case expr_product_type:
  case expr_rtrim:
  case expr_string:
  case expr_strtime:
  case expr_substr:
  case expr_trim:
switchD_00110ffb_caseD_10:
    pcVar6->result_type = coda_expression_string;
    break;
  case expr_ceil:
  case expr_float:
  case expr_floor:
  case expr_power:
  case expr_round:
  case expr_time:
switchD_00110ffb_caseD_11:
    pcVar6->result_type = coda_expression_float;
    break;
  case expr_constant_boolean:
  case expr_constant_float:
  case expr_constant_integer:
  case expr_constant_rawstring:
  case expr_constant_string:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                  ,0x222,
                  "coda_expression *coda_expression_new(coda_expression_node_type, char *, coda_expression *, coda_expression *, coda_expression *, coda_expression *)"
                 );
  case expr_for:
  case expr_goto:
  case expr_sequence:
  case expr_variable_set:
    pcVar6->result_type = coda_expression_void;
    break;
  case expr_regex:
    if (op3 != (coda_expression *)0x0) goto switchD_00110ffb_caseD_10;
    goto switchD_00110ffb_caseD_4;
  }
switchD_00110ffb_default:
  uVar5 = 0;
  if ((((((0x3a < tag - expr_file_size) ||
         ((0x7000f0000000003U >> ((ulong)(tag - expr_file_size) & 0x3f) & 1) == 0)) &&
        (pcVar6->result_type != coda_expression_node)) &&
       ((op1 == (coda_expression *)0x0 || (op1->is_constant != 0)))) &&
      ((op2 == (coda_expression *)0x0 || (op2->is_constant != 0)))) &&
     ((op3 == (coda_expression *)0x0 || (op3->is_constant != 0)))) {
    if (local_38 == (coda_expression *)0x0) {
      uVar5 = 1;
    }
    else {
      uVar5 = (uint)(local_38->is_constant != 0);
    }
  }
  pcVar6->is_constant = uVar5;
  pcVar6->recursion_depth = 0;
  if ((op1 != (coda_expression *)0x0) && (-1 < op1->recursion_depth)) {
    pcVar6->recursion_depth = op1->recursion_depth + 1;
  }
  if ((op2 != (coda_expression *)0x0) && (pcVar6->recursion_depth <= op2->recursion_depth)) {
    pcVar6->recursion_depth = op2->recursion_depth + 1;
  }
  if ((op3 != (coda_expression *)0x0) && (pcVar6->recursion_depth <= op3->recursion_depth)) {
    pcVar6->recursion_depth = op3->recursion_depth + 1;
  }
  if ((local_38 != (coda_expression *)0x0) && (pcVar6->recursion_depth <= local_38->recursion_depth)
     ) {
    pcVar6->recursion_depth = local_38->recursion_depth + 1;
  }
  if (10000 < pcVar6->recursion_depth) {
    coda_set_error(-0x191,"maximum recursion depth (%ld) reached",10000);
    coda_expression_delete(pcVar6);
    return (coda_expression *)0x0;
  }
  return pcVar6;
switchD_00110ffb_caseD_4:
  pcVar6->result_type = coda_expression_boolean;
  goto switchD_00110ffb_default;
LAB_00111241:
  string_value[lVar12] = '\0';
LAB_00111387:
  if (lVar12 < 0) {
    free(string_value);
    return (coda_expression *)0x0;
  }
  pcVar6 = (coda_expression *)malloc(0x20);
  if (pcVar6 != (coda_expression *)0x0) {
    pcVar6->tag = expr_constant_string;
    pcVar6->result_type = coda_expression_string;
    pcVar6->is_constant = 1;
    pcVar6->recursion_depth = 0;
    pcVar6[1].tag = (int)lVar12;
    pcVar6[1].result_type = (int)((ulong)lVar12 >> 0x20);
    *(char **)&pcVar6[1].is_constant = string_value;
    return pcVar6;
  }
  uVar8 = 0x20;
  uVar11 = 0x153;
  goto LAB_001113e4;
}

Assistant:

coda_expression *coda_expression_new(coda_expression_node_type tag, char *string_value, coda_expression *op1,
                                     coda_expression *op2, coda_expression *op3, coda_expression *op4)
{
    coda_expression_operation *expr;

    switch (tag)
    {
        case expr_constant_boolean:
            return boolean_constant_new(string_value);
        case expr_constant_float:
            return float_constant_new(string_value);
        case expr_constant_integer:
            return integer_constant_new(string_value);
        case expr_constant_rawstring:
            return rawstring_constant_new(string_value);
        case expr_constant_string:
            return string_constant_new(string_value);
        default:
            break;
    }

    if (tag == expr_neg)
    {
        /* turn constant numbers into negative constant values */
        if (op1->tag == expr_constant_float)
        {
            ((coda_expression_float_constant *)op1)->value = -((coda_expression_float_constant *)op1)->value;
            return op1;
        }
        if (op1->tag == expr_constant_integer)
        {
            ((coda_expression_integer_constant *)op1)->value = -((coda_expression_integer_constant *)op1)->value;
            return op1;
        }
    }

    expr = malloc(sizeof(coda_expression_operation));
    if (expr == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_expression_operation), __FILE__, __LINE__);
        if (string_value != NULL)
        {
            free(string_value);
        }
        if (op1 != NULL)
        {
            coda_expression_delete(op1);
        }
        if (op2 != NULL)
        {
            coda_expression_delete(op2);
        }
        if (op3 != NULL)
        {
            coda_expression_delete(op3);
        }
        if (op4 != NULL)
        {
            coda_expression_delete(op4);
        }
        return NULL;
    }
    expr->tag = tag;
    expr->identifier = string_value;
    expr->operand[0] = op1;
    expr->operand[1] = op2;
    expr->operand[2] = op3;
    expr->operand[3] = op4;

    switch (tag)
    {
        case expr_array_all:
        case expr_array_exists:
        case expr_equal:
        case expr_exists:
        case expr_greater_equal:
        case expr_greater:
        case expr_isinf:
        case expr_ismininf:
        case expr_isnan:
        case expr_isplusinf:
        case expr_less_equal:
        case expr_less:
        case expr_logical_and:
        case expr_logical_or:
        case expr_not_equal:
        case expr_not:
        case expr_variable_exists:
            expr->result_type = coda_expression_boolean;
            break;
        case expr_power:
        case expr_ceil:
        case expr_float:
        case expr_floor:
        case expr_round:
        case expr_time:
            expr->result_type = coda_expression_float;
            break;
        case expr_and:
        case expr_array_count:
        case expr_array_index:
        case expr_bit_offset:
        case expr_bit_size:
        case expr_byte_offset:
        case expr_byte_size:
        case expr_dim:
        case expr_file_size:
        case expr_index:
        case expr_index_var:
        case expr_integer:
        case expr_length:
        case expr_num_dims:
        case expr_num_elements:
        case expr_or:
        case expr_product_version:
        case expr_unbound_array_index:
        case expr_variable_index:
        case expr_variable_value:
            expr->result_type = coda_expression_integer;
            break;
        case expr_bytes:
        case expr_filename:
        case expr_ltrim:
        case expr_product_class:
        case expr_product_format:
        case expr_product_type:
        case expr_rtrim:
        case expr_string:
        case expr_strtime:
        case expr_substr:
        case expr_trim:
            expr->result_type = coda_expression_string;
            break;
        case expr_for:
        case expr_goto:
        case expr_sequence:
        case expr_variable_set:
            expr->result_type = coda_expression_void;
            break;
        case expr_asciiline:
        case expr_goto_array_element:
        case expr_goto_attribute:
        case expr_goto_begin:
        case expr_goto_field:
        case expr_goto_here:
        case expr_goto_parent:
        case expr_goto_root:
            expr->result_type = coda_expression_node;
            break;
        case expr_abs:
        case expr_neg:
            expr->result_type = op1->result_type;
            break;
        case expr_add:
        case expr_divide:
        case expr_max:
        case expr_min:
        case expr_modulo:
        case expr_multiply:
        case expr_subtract:
            if (op1->result_type == coda_expression_float || op2->result_type == coda_expression_float)
            {
                /* allow one of the arguments to be an integer */
                expr->result_type = coda_expression_float;
            }
            else
            {
                expr->result_type = op1->result_type;
            }
            break;
        case expr_array_add:
        case expr_array_max:
        case expr_array_min:
        case expr_at:
        case expr_if:
        case expr_with:
            expr->result_type = op2->result_type;
            break;
        case expr_regex:
            if (op3 == NULL)
            {
                expr->result_type = coda_expression_boolean;
            }
            else
            {
                expr->result_type = coda_expression_string;
            }
            break;
        case expr_constant_boolean:
        case expr_constant_float:
        case expr_constant_integer:
        case expr_constant_rawstring:
        case expr_constant_string:
            assert(0);
            exit(1);
    }

    switch (expr->tag)
    {
        case expr_file_size:
        case expr_filename:
        case expr_product_class:
        case expr_product_format:
        case expr_product_type:
        case expr_product_version:
        case expr_variable_index:
        case expr_variable_set:
        case expr_variable_value:
            expr->is_constant = 0;
            break;
        default:
            expr->is_constant = expr->result_type != coda_expression_node && (op1 == NULL || op1->is_constant) &&
                (op2 == NULL || op2->is_constant) && (op3 == NULL || op3->is_constant) &&
                (op4 == NULL || op4->is_constant);
    }

    expr->recursion_depth = 0;
    if (op1 != NULL)
    {
        if (op1->recursion_depth + 1 > expr->recursion_depth)
        {
            expr->recursion_depth = op1->recursion_depth + 1;
        }
    }
    if (op2 != NULL)
    {
        if (op2->recursion_depth + 1 > expr->recursion_depth)
        {
            expr->recursion_depth = op2->recursion_depth + 1;
        }
    }
    if (op3 != NULL)
    {
        if (op3->recursion_depth + 1 > expr->recursion_depth)
        {
            expr->recursion_depth = op3->recursion_depth + 1;
        }
    }
    if (op4 != NULL)
    {
        if (op4->recursion_depth + 1 > expr->recursion_depth)
        {
            expr->recursion_depth = op4->recursion_depth + 1;
        }
    }
    if (expr->recursion_depth > CODA_MAX_RECURSION_DEPTH)
    {
        coda_set_error(CODA_ERROR_EXPRESSION, "maximum recursion depth (%ld) reached", CODA_MAX_RECURSION_DEPTH);
        coda_expression_delete((coda_expression *)expr);
        return NULL;
    }

    return (coda_expression *)expr;
}